

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::internal::
parse_format_string<false,char,fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>,char,fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>&>
          (internal *this,basic_string_view<char> format_str,
          format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
          *handler)

{
  internal *end;
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  internal *piVar4;
  void *pvVar5;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
  *this_00;
  internal iVar6;
  char *message;
  internal *piVar7;
  internal *end_00;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>_1
  local_58;
  type local_48;
  
  this_00 = (format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
             *)format_str.size_;
  end_00 = (internal *)(format_str.data_ + (long)this);
  do {
    if (this == end_00) {
      return;
    }
    piVar4 = this;
    if ((*this == (internal)0x7b) ||
       (piVar4 = (internal *)memchr(this,0x7b,(long)end_00 - (long)this), piVar7 = this,
       piVar4 != (internal *)0x0)) {
      piVar7 = this;
      if (this != piVar4) {
        do {
          pvVar5 = memchr(piVar7,0x7d,(long)piVar4 - (long)piVar7);
          if (pvVar5 == (void *)0x0) {
            format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
            ::on_text(this_00,(char *)piVar7,(char *)piVar4);
LAB_001631b0:
            bVar3 = false;
          }
          else {
            end = (internal *)((long)pvVar5 + 1);
            if ((end == piVar4) || (*end != (internal)0x7d)) {
              error_handler::on_error((error_handler *)this_00,"unmatched \'}\' in format string");
              goto LAB_001631b0;
            }
            format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
            ::on_text(this_00,(char *)piVar7,(char *)end);
            piVar7 = (internal *)((long)pvVar5 + 2);
            bVar3 = true;
          }
        } while (bVar3);
      }
      piVar4 = piVar4 + 1;
      if (piVar4 == end_00) {
        message = "invalid format string";
        goto LAB_00163206;
      }
      if (*piVar4 == (internal)0x7b) {
        piVar7 = (internal *)
                 (this_00->context).
                 super_context_base<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char>
                 .out_.super_truncating_iterator_base<char_*>.out_;
        uVar1 = (this_00->context).
                super_context_base<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char>
                .out_.super_truncating_iterator_base<char_*>.limit_;
        uVar2 = (this_00->context).
                super_context_base<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char>
                .out_.super_truncating_iterator_base<char_*>.count_;
        iVar6 = *piVar4;
        if (uVar2 < uVar1) {
          iVar6 = (internal)
                  (this_00->context).
                  super_context_base<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char>
                  .out_.blackhole_;
          *piVar7 = *piVar4;
        }
        (this_00->context).
        super_context_base<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char>
        .out_.super_truncating_iterator_base<char_*>.out_ = (char *)(piVar7 + (uVar2 < uVar1));
        (this_00->context).
        super_context_base<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char>
        .out_.super_truncating_iterator_base<char_*>.limit_ = uVar1;
        (this_00->context).
        super_context_base<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char>
        .out_.super_truncating_iterator_base<char_*>.count_ = uVar2 + 1;
        (this_00->context).
        super_context_base<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char>
        .out_.blackhole_ = (value_type)iVar6;
      }
      else {
        if (*piVar4 != (internal)0x7d) {
          local_58._0_8_ = this_00;
          piVar4 = (internal *)
                   parse_arg_id<char,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>,char,fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>&,char>>
                             ((char *)piVar4,(char *)end_00,
                              (id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>_&,_char>
                               *)&local_58.string);
          if (piVar4 == end_00) {
            iVar6 = (internal)0x0;
          }
          else {
            iVar6 = *piVar4;
          }
          if (iVar6 == (internal)0x3a) {
            piVar4 = (internal *)
                     format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
                     ::on_format_specs(this_00,(char *)(piVar4 + 1),(char *)end_00);
            if ((piVar4 != end_00) && (*piVar4 == (internal)0x7d)) goto LAB_001632ed;
            message = "unknown format specifier";
          }
          else {
            if (iVar6 == (internal)0x7d) goto LAB_001632e2;
            message = "missing \'}\' in format string";
          }
LAB_00163206:
          error_handler::on_error((error_handler *)this_00,message);
          goto LAB_00163274;
        }
        basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>
        ::next_arg((format_arg *)&local_58.string,&this_00->context);
        (this_00->arg).type_ = local_48;
        (this_00->arg).value_.field_0.long_long_value = local_58.long_long_value;
        (this_00->arg).value_.field_0.string.size = local_58.string.size;
LAB_001632e2:
        format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
        ::on_replacement_field(this_00,(char *)piVar4);
      }
LAB_001632ed:
      this = piVar4 + 1;
      bVar3 = true;
    }
    else {
      do {
        pvVar5 = memchr(piVar7,0x7d,(long)end_00 - (long)piVar7);
        if (pvVar5 == (void *)0x0) {
          format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
          ::on_text(this_00,(char *)piVar7,(char *)end_00);
LAB_0016326e:
          bVar3 = false;
        }
        else {
          piVar4 = (internal *)((long)pvVar5 + 1);
          if ((piVar4 == end_00) || (*piVar4 != (internal)0x7d)) {
            error_handler::on_error((error_handler *)this_00,"unmatched \'}\' in format string");
            goto LAB_0016326e;
          }
          format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
          ::on_text(this_00,(char *)piVar7,(char *)piVar4);
          piVar7 = (internal *)((long)pvVar5 + 2);
          bVar3 = true;
        }
      } while (bVar3);
LAB_00163274:
      bVar3 = false;
    }
    if (!bVar3) {
      return;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(
        basic_string_view<Char> format_str, Handler &&handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char *begin, const Char *end) {
      if (begin == end) return;
      for (;;) {
        const Char *p = FMT_NULL;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler &handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char *p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end)
      return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}